

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

MIR_reg_t get_new_ssa_reg(gen_ctx_t gen_ctx,MIR_reg_t reg,int sep,int new_p)

{
  void **ppvVar1;
  size_t sVar2;
  MIR_item_t_conflict pMVar3;
  MIR_func_t func;
  gen_ctx *pgVar4;
  VARR_char *pVVar5;
  MIR_context_t ctx;
  FILE *__stream;
  char cVar6;
  MIR_type_t type;
  MIR_reg_t MVar7;
  MIR_reg_t extraout_EAX;
  undefined1 *puVar8;
  size_t *psVar9;
  VARR_size_t *__s;
  long *hard_reg_name;
  char *pcVar10;
  MIR_func_t pMVar11;
  MIR_item_t pMVar12;
  size_t sVar13;
  c2mir_ctx *pcVar14;
  VARR_size_t *pVVar15;
  char *pcVar16;
  int iVar17;
  MIR_item_t_conflict pMVar18;
  gen_ctx *pgVar19;
  uint extraout_EDX;
  gen_ctx_t unaff_RBX;
  VARR_char *unaff_RBP;
  undefined4 in_register_00000034;
  MIR_func_t pMVar20;
  gen_ctx_t __ptr;
  gen_ctx_t gen_ctx_00;
  long *in_R8;
  undefined8 in_R9;
  uint uVar21;
  MIR_func_t unaff_R13;
  MIR_func_t unaff_R14;
  gen_ctx_t unaff_R15;
  bool bVar22;
  
  pMVar20 = (MIR_func_t)CONCAT44(in_register_00000034,reg);
  psVar9 = (size_t *)(ulong)(uint)new_p;
  __s = gen_ctx->ssa_ctx->curr_reg_indexes;
  __ptr = gen_ctx;
  if (__s != (VARR_size_t *)0x0) {
    unaff_R14 = (MIR_func_t)(ulong)(uint)new_p;
    unaff_R13 = (MIR_func_t)(ulong)reg;
    unaff_R15 = (gen_ctx_t)(ulong)reg;
    do {
      iVar17 = (int)psVar9;
      __ptr = (gen_ctx_t)__s->varr;
      if (unaff_R15 < (gen_ctx_t)__s->els_num) goto LAB_001618a2;
      if (__ptr == (gen_ctx_t)0x0) {
        get_new_ssa_reg_cold_1();
        goto LAB_00161b38;
      }
      puVar8 = (undefined1 *)((long)&((gen_ctx_t)__s->els_num)->ctx + 1);
      if ((undefined1 *)__s->size < puVar8) {
        unaff_RBP = (VARR_char *)(puVar8 + ((ulong)puVar8 >> 1));
        pMVar20 = (MIR_func_t)((long)unaff_RBP * 8);
        psVar9 = (size_t *)realloc(__ptr,(size_t)pMVar20);
        __s->varr = psVar9;
        __s->size = (size_t)unaff_RBP;
      }
      sVar2 = __s->els_num;
      psVar9 = __s->varr;
      __s->els_num = sVar2 + 1;
      psVar9[sVar2] = 0;
      __s = gen_ctx->ssa_ctx->curr_reg_indexes;
      unaff_RBX = gen_ctx;
    } while (__s != (VARR_size_t *)0x0);
  }
  gen_ctx = unaff_RBX;
  iVar17 = (int)psVar9;
  get_new_ssa_reg_cold_9();
LAB_001618a2:
  if (__ptr == (gen_ctx_t)0x0) {
LAB_00161b38:
    get_new_ssa_reg_cold_8();
LAB_00161b3d:
    get_new_ssa_reg_cold_7();
LAB_00161b42:
    get_new_ssa_reg_cold_6();
LAB_00161b47:
    hard_reg_name = in_R8;
    gen_ctx_00 = __ptr;
    get_new_ssa_reg_cold_5();
LAB_00161b4c:
    get_new_ssa_reg_cold_3();
LAB_00161b51:
    get_new_ssa_reg_cold_2();
  }
  else {
    pMVar3 = (MIR_item_t_conflict)
             __ptr->call_used_hard_regs[(long)((long)&unaff_R15[-1].spot2attr + 3)];
    __ptr->call_used_hard_regs[(long)((long)&unaff_R15[-1].spot2attr + 3)] =
         (bitmap_t)((long)&pMVar3->data + 1);
    if (((int)unaff_R14 == 0) && (pMVar3 == (MIR_item_t_conflict)0x0)) {
      return 0xffffffff;
    }
    gen_ctx_00 = (gen_ctx_t)gen_ctx->ctx;
    func = (gen_ctx->curr_func_item->u).func;
    uVar21 = (int)unaff_R13 - 0x21;
    unaff_R13 = (MIR_func_t)(ulong)uVar21;
    pMVar18 = pMVar3;
    type = MIR_reg_type((MIR_context_t)gen_ctx_00,uVar21,func);
    __s = (VARR_size_t *)MIR_reg_name((MIR_context_t)gen_ctx_00,uVar21,func);
    pMVar20 = unaff_R13;
    __ptr = gen_ctx_00;
    hard_reg_name = (long *)MIR_reg_hard_reg_name((MIR_context_t)gen_ctx_00,uVar21,func);
    iVar17 = (int)pMVar18;
    unaff_RBP = gen_ctx->ssa_ctx->reg_name;
    unaff_R14 = func;
    unaff_R15 = gen_ctx_00;
    if ((unaff_RBP == (VARR_char *)0x0) ||
       (unaff_R14 = (MIR_func_t)unaff_RBP->varr, unaff_R14 == (MIR_func_t)0x0)) goto LAB_00161b3d;
    unaff_RBP->els_num = 0;
    unaff_R13 = (MIR_func_t)strlen((char *)__s);
    if ((MIR_func_t)unaff_RBP->size < unaff_R13) {
      pMVar11 = (MIR_func_t)((long)&unaff_R13->name + ((ulong)unaff_R13 >> 1));
      pMVar20 = pMVar11;
      pcVar10 = (char *)realloc(unaff_R14,(size_t)pMVar11);
      unaff_RBP->varr = pcVar10;
      unaff_RBP->size = (size_t)pMVar11;
    }
    if (unaff_R13 != (MIR_func_t)0x0) {
      pMVar11 = (MIR_func_t)0x0;
      do {
        pMVar18 = (MIR_item_t_conflict)unaff_RBP->els_num;
        puVar8 = (undefined1 *)((long)&pMVar18->data + 1);
        unaff_RBP->els_num = (size_t)puVar8;
        cVar6 = *(char *)((long)&pMVar11->name + (long)&__s->els_num);
        pMVar20 = (MIR_func_t)CONCAT71((int7)((ulong)puVar8 >> 8),cVar6);
        unaff_RBP->varr[(long)pMVar18] = cVar6;
        pMVar11 = (MIR_func_t)((long)&pMVar11->name + 1);
      } while (unaff_R13 != pMVar11);
    }
    iVar17 = (int)pMVar18;
    unaff_R15 = (gen_ctx_t)gen_ctx->ssa_ctx->reg_name;
    __ptr = (gen_ctx_t)unaff_R15->curr_func_item;
    if (__ptr == (gen_ctx_t)0x0) goto LAB_00161b42;
    pcVar14 = (c2mir_ctx *)((long)&((gen_ctx *)unaff_R15->ctx)->ctx + 1);
    if (*(c2mir_ctx **)&unaff_R15->optimize_level < pcVar14) {
      pMVar12 = (MIR_item_t)realloc(__ptr,(size_t)(pcVar14 + ((ulong)pcVar14 >> 1)));
      unaff_R15->curr_func_item = pMVar12;
      *(c2mir_ctx **)&unaff_R15->optimize_level = pcVar14 + ((ulong)pcVar14 >> 1);
    }
    pgVar4 = (gen_ctx *)unaff_R15->ctx;
    pgVar19 = (gen_ctx *)unaff_R15->curr_func_item;
    unaff_R15->ctx = (MIR_context_t)((long)&pgVar4->ctx + 1);
    *(code *)((long)&pgVar19->ctx + (long)pgVar4) = SUB41(sep,0);
    pMVar20 = (MIR_func_t)0x1bb553;
    unaff_R14 = (MIR_func_t)&stack0xffffffffffffffa8;
    sprintf((char *)unaff_R14,"%lu",pMVar3);
    unaff_R15 = (gen_ctx_t)gen_ctx->ssa_ctx->reg_name;
    sVar13 = strlen((char *)unaff_R14);
    iVar17 = (int)pgVar19;
    __ptr = (gen_ctx_t)unaff_R15->curr_func_item;
    if (__ptr == (gen_ctx_t)0x0) goto LAB_00161b47;
    __s = (VARR_size_t *)(sVar13 + 1);
    pcVar14 = (c2mir_ctx *)((long)&__s->els_num + (long)unaff_R15->ctx);
    if (*(c2mir_ctx **)&unaff_R15->optimize_level < pcVar14) {
      unaff_R14 = (MIR_func_t)(pcVar14 + ((ulong)pcVar14 >> 1));
      pMVar20 = unaff_R14;
      pMVar12 = (MIR_item_t)realloc(__ptr,(size_t)unaff_R14);
      unaff_R15->curr_func_item = pMVar12;
      *(MIR_func_t *)&unaff_R15->optimize_level = unaff_R14;
    }
    if (__s != (VARR_size_t *)0x0) {
      pVVar15 = (VARR_size_t *)0x0;
      do {
        pgVar19 = (gen_ctx *)unaff_R15->ctx;
        pgVar4 = (gen_ctx *)((long)&pgVar19->ctx + 1);
        unaff_R15->ctx = (MIR_context_t)pgVar4;
        pMVar20 = (MIR_func_t)
                  CONCAT71((int7)((ulong)pgVar4 >> 8),(&stack0xffffffffffffffa8)[(long)pVVar15]);
        *(undefined1 *)((long)&pgVar19->ctx + (long)&unaff_R15->curr_func_item->data) =
             (&stack0xffffffffffffffa8)[(long)pVVar15];
        pVVar15 = (VARR_size_t *)((long)&pVVar15->els_num + 1);
      } while (__s != pVVar15);
    }
    iVar17 = (int)pgVar19;
    pVVar5 = gen_ctx->ssa_ctx->reg_name;
    if (hard_reg_name != (long *)0x0) {
      if (pVVar5 == (VARR_char *)0x0) goto LAB_00161b4c;
      pcVar10 = pVVar5->varr;
      MVar7 = MIR_new_global_func_reg
                        ((MIR_context_t)gen_ctx_00,func,type,pcVar10,(char *)hard_reg_name);
      iVar17 = (int)pcVar10;
      uVar21 = MVar7 + 0x21;
      unaff_R14 = (MIR_func_t)(ulong)uVar21;
      unaff_R15 = (gen_ctx_t)gen_ctx->tied_regs;
      pMVar20 = (MIR_func_t)((long)&unaff_R14->name + 1);
      gen_ctx_00 = unaff_R15;
      bitmap_expand((bitmap_t)unaff_R15,(size_t)pMVar20);
      if (unaff_R15 != (gen_ctx_t)0x0) {
        ppvVar1 = &unaff_R15->curr_func_item->data + (uVar21 >> 6);
        *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << ((ulong)unaff_R14 & 0x3f));
        goto LAB_00161b0c;
      }
      goto LAB_00161b51;
    }
    if (pVVar5 != (VARR_char *)0x0) {
      MVar7 = MIR_new_func_reg((MIR_context_t)gen_ctx_00,func,type,pVVar5->varr);
      uVar21 = MVar7 + 0x21;
LAB_00161b0c:
      if ((uVar21 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar21)) {
        gen_ctx->curr_cfg->max_var = uVar21;
      }
      return uVar21;
    }
  }
  get_new_ssa_reg_cold_4();
  if (extraout_EDX < 0x22) {
    __assert_fail("reg > ST1_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x5d8,
                  "void rename_op_reg(gen_ctx_t, MIR_op_t *, MIR_reg_t, MIR_reg_t, MIR_insn_t, int)"
                 );
  }
  ctx = gen_ctx_00->ctx;
  cVar6 = (char)*(ushort *)&pMVar20->func_item;
  if (cVar6 == '\v') {
LAB_00161b9c:
    bVar22 = *(uint *)&(pMVar20->insns).tail == extraout_EDX;
    if (bVar22) {
      *(int *)&(pMVar20->insns).tail = iVar17;
    }
    uVar21 = (uint)bVar22;
    if (*(uint *)((long)&(pMVar20->insns).tail + 4) != extraout_EDX) goto LAB_00161bb8;
    *(int *)((long)&(pMVar20->insns).tail + 4) = iVar17;
  }
  else {
    uVar21 = 0;
    if (cVar6 != '\x02') goto LAB_00161bb8;
    if ((uint)pMVar20->original_vars_num != extraout_EDX) {
      if ((*(ushort *)&pMVar20->func_item & 0xff) != 0xb) goto LAB_00161bb8;
      goto LAB_00161b9c;
    }
    *(int *)&pMVar20->original_vars_num = iVar17;
  }
  uVar21 = 1;
LAB_00161bb8:
  if (((uVar21 != 0) && (__stream = (FILE *)gen_ctx_00->debug_file, __stream != (FILE *)0x0)) &&
     (1 < gen_ctx_00->debug_level)) {
    pMVar20 = (gen_ctx_00->curr_func_item->u).func;
    pcVar10 = MIR_reg_name(ctx,extraout_EDX - 0x21,pMVar20);
    pcVar16 = MIR_reg_name(ctx,iVar17 - 0x21,pMVar20);
    fprintf(__stream,"    Change %s to %s in insn %-5lu",pcVar10,pcVar16,
            (ulong)*(uint *)(*hard_reg_name + 0xc),in_R9,pcVar10,gen_ctx,__s,unaff_R13,unaff_R14,
            unaff_R15,unaff_RBP);
    print_bb_insn(gen_ctx_00,(bb_insn_t_conflict)*hard_reg_name,0);
    return extraout_EAX;
  }
  return uVar21;
}

Assistant:

static MIR_reg_t get_new_ssa_reg (gen_ctx_t gen_ctx, MIR_reg_t reg, int sep, int new_p) {
  size_t reg_index;

  while (VARR_LENGTH (size_t, curr_reg_indexes) <= reg) VARR_PUSH (size_t, curr_reg_indexes, 0);
  reg_index = VARR_GET (size_t, curr_reg_indexes, reg);
  VARR_SET (size_t, curr_reg_indexes, reg, reg_index + 1);
  return reg_index == 0 && !new_p ? MIR_NON_VAR : get_new_reg (gen_ctx, reg, sep, reg_index);
}